

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O2

int Bmc_FxComputeOne(Gia_Man_t *p,int nIterMax,int nDiv2Add)

{
  int nVars;
  void *__ptr;
  int iCiVarBeg;
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  ulong uVar3;
  Vec_Wec_t *vCubes;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vDivs;
  long lVar5;
  char *__s;
  Vec_Int_t *__ptr_00;
  int iVar6;
  uint iAuxVar;
  long lVar7;
  int iVarStart;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  nVars = p->vCis->nSize;
  iVarStart = p_00->nVars;
  iCiVarBeg = iVarStart - nVars;
  iVar1 = sat_solver_nvars(s);
  sat_solver_setnvars(s,nIterMax + iVar1 + 0x3e9);
  if (nIterMax < 1) {
    nIterMax = 0;
  }
  uVar3 = 0;
  do {
    iVar2 = (int)uVar3;
    if (iVar2 == nIterMax) {
      sat_solver_delete(s);
      Cnf_DataFree(p_00);
      return 1;
    }
    vCubes = (Vec_Wec_t *)malloc(0x10);
    vCubes->nCap = 1000;
    vCubes->nSize = 0;
    pVVar4 = (Vec_Int_t *)calloc(1000,0x10);
    vCubes->pArray = pVVar4;
    pVVar4 = Vec_IntAlloc(iVarStart - iCiVarBeg);
    for (iVar6 = iCiVarBeg; iVar6 < iVarStart; iVar6 = iVar6 + 1) {
      Vec_IntPush(pVVar4,iVar6);
    }
    iAuxVar = iVar1 + 1000 + iVar2;
    printf("\nIteration %d (Aux = %d)\n",uVar3,(ulong)iAuxVar);
    iVar6 = Bmc_FxSolve(s,0,iAuxVar,pVVar4,1,1,(int *)0x0,vCubes);
    __s = "Mismatch";
    if (iVar6 == 0) {
LAB_0049a004:
      puts(__s);
    }
    else if (iVar6 == -1) {
      __s = "Timeout";
      goto LAB_0049a004;
    }
    vDivs = Div_CubePairs(vCubes,nVars,nDiv2Add);
    __ptr_00 = vCubes->pArray;
    lVar5 = 8;
    for (lVar7 = 0; lVar7 < vCubes->nCap; lVar7 = lVar7 + 1) {
      __ptr = *(void **)((long)&__ptr_00->nCap + lVar5);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        __ptr_00 = vCubes->pArray;
        *(undefined8 *)((long)&__ptr_00->nCap + lVar5) = 0;
      }
      lVar5 = lVar5 + 0x10;
    }
    free(__ptr_00);
    free(vCubes);
    Bmc_FxAddClauses(s,vDivs,iCiVarBeg,iVarStart);
    iVar6 = vDivs->nSize;
    Vec_IntFree(vDivs);
    if (nVars + 1000 < pVVar4->nSize) {
      __assert_fail("Vec_IntSize(vVar2Sat) <= nCiVars + Extra",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                    ,0x2c5,"int Bmc_FxComputeOne(Gia_Man_t *, int, int)");
    }
    iVarStart = iVarStart + iVar6 / 4;
    Vec_IntFree(pVVar4);
    uVar3 = (ulong)(iVar2 + 1);
  } while( true );
}

Assistant:

int Bmc_FxComputeOne( Gia_Man_t * p, int nIterMax, int nDiv2Add )
{
    int Extra    = 1000;
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // compute parameters
    int nCiVars   = Gia_ManCiNum(p);             // PI count
    int iCiVarBeg = pCnf->nVars - nCiVars;//- 1;   // first PI var
    int iCiVarCur = iCiVarBeg + nCiVars;         // current unused PI var
    int n, Iter, RetValue;
    // create variables
    int iAuxVarStart = sat_solver_nvars(pSat) + Extra; // the aux var
    sat_solver_setnvars( pSat, iAuxVarStart + 1 + nIterMax );
    for ( Iter = 0; Iter < nIterMax; Iter++ )
    {
        Vec_Wec_t * vCubes = Vec_WecAlloc( 1000 );
        // collect variables
        Vec_Int_t * vVar2Sat = Vec_IntAlloc( iCiVarCur-iCiVarBeg ), * vDivs;
//        for ( n = iCiVarCur - 1; n >= iCiVarBeg; n-- )
        for ( n = iCiVarBeg; n < iCiVarCur; n++ )
            Vec_IntPush( vVar2Sat, n );
        // iterate through outputs
        printf( "\nIteration %d (Aux = %d)\n", Iter, iAuxVarStart + Iter );
        RetValue = Bmc_FxSolve( pSat, 0, iAuxVarStart + Iter, vVar2Sat, 1, 1, NULL, vCubes );
        if ( RetValue == 0 )
            printf( "Mismatch\n" );
        if ( RetValue == -1 )
            printf( "Timeout\n" );
        // print cubes
        //Div_CubePrint( vCubes, nCiVars );
        vDivs = Div_CubePairs( vCubes, nCiVars, nDiv2Add );
        Vec_WecFree( vCubes );
        // add clauses and update variables
        Bmc_FxAddClauses( pSat, vDivs, iCiVarBeg, iCiVarCur );
        iCiVarCur += Vec_IntSize(vDivs)/4;
        Vec_IntFree( vDivs );
        // cleanup
        assert( Vec_IntSize(vVar2Sat) <= nCiVars + Extra );
        Vec_IntFree( vVar2Sat );
    }
    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return 1;
}